

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O3

void __thiscall Object_GetNotFound_Test::TestBody(Object_GetNotFound_Test *this)

{
  size_type *psVar1;
  string *psVar2;
  char *message;
  initializer_list<pstore::dump::object::member> __l;
  value_ptr v;
  undefined1 local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_a8;
  undefined1 local_90 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_60 [24];
  pointer local_48;
  undefined1 local_40 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_30;
  undefined1 local_20;
  
  local_40._0_8_ = "Hello World";
  local_90._0_8_ = (string *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstore::dump::string,std::allocator<pstore::dump::string>,char_const*&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8),(string **)local_90,
             (allocator<pstore::dump::string> *)local_c8,(char **)local_40);
  local_60._16_8_ = local_90._0_8_;
  local_48 = (pointer)local_90._8_8_;
  if ((pointer)local_90._8_8_ != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      psVar1 = &((string *)local_90._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
      UNLOCK();
      if ((pointer)local_90._8_8_ == (pointer)0x0) goto LAB_0014ff30;
    }
    else {
      psVar1 = &((string *)local_90._8_8_)->_M_string_length;
      *(int *)psVar1 = (int)*psVar1 + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
LAB_0014ff30:
  local_c8 = (undefined1  [8])&local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"key","");
  pstore::dump::object::member::member
            ((member *)local_90,(string *)local_c8,(value_ptr *)(local_60 + 0x10));
  __l._M_len = 1;
  __l._M_array = (iterator)local_90;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_a8,__l,(allocator_type *)local_60);
  local_40._0_8_ = &PTR__object_001f2ba0;
  local_40._8_8_ =
       local_a8.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_start;
  aStack_30._M_allocated_capacity =
       (size_type)
       local_a8.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  aStack_30._8_8_ =
       local_a8.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20 = 0;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_a8);
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  psVar2 = (string *)(local_90 + 0x10);
  if ((string *)local_90._0_8_ != psVar2) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if (local_c8 != (undefined1  [8])&local_b8) {
    operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
  }
  local_a8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90._0_8_ = psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"missing","");
  pstore::dump::object::get((object *)local_60,(string *)local_40);
  testing::internal::
  CmpHelperEQ<std::shared_ptr<pstore::dump::value>,std::shared_ptr<pstore::dump::value>>
            ((internal *)local_c8,"std::shared_ptr<value> (nullptr)","object.get (\"missing\")",
             (shared_ptr<pstore::dump::value> *)&local_a8,
             (shared_ptr<pstore::dump::value> *)local_60);
  if ((pointer)local_60._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_);
  }
  if ((string *)local_90._0_8_ != psVar2) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if (local_a8.
      super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.
               super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_90);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_object.cpp"
               ,0xa3,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((string *)local_90._0_8_ != (string *)0x0) {
      (**(code **)(*(long *)local_90._0_8_ + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            ((vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> *)
             (local_40 + 8));
  pstore::dump::number_base::~number_base((number_base *)local_40);
  if (local_48 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  return;
}

Assistant:

TEST (Object, GetNotFound) {
    using namespace ::pstore::dump;
    auto v = make_value ("Hello World");
    object object{{{"key", v}}};
    EXPECT_EQ (std::shared_ptr<value> (nullptr), object.get ("missing"));
}